

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

void av1_rd_pick_intra_mode_sb
               (AV1_COMP *cpi,macroblock *x,RD_STATS *rd_cost,BLOCK_SIZE bsize,
               PICK_MODE_CONTEXT *ctx,int64_t best_rd)

{
  CANDIDATE_MV *pCVar1;
  uint8_t uVar2;
  TX_SIZE_SEARCH_METHOD TVar3;
  int iVar4;
  MB_RD_RECORD *pMVar5;
  MB_MODE_INFO *pMVar6;
  MB_MODE_INFO *pMVar7;
  SequenceHeader *pSVar8;
  IntraBCMVCosts *dv_costs;
  BLOCK_SIZE bsize_00;
  CANDIDATE_MV CVar9;
  CANDIDATE_MV CVar10;
  CANDIDATE_MV CVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  byte bVar17;
  bool bVar18;
  uint uVar19;
  int iVar20;
  int64_t iVar21;
  long lVar22;
  buf_2d *pbVar23;
  TX_MODE TVar24;
  int iVar25;
  int_mv iVar26;
  undefined7 in_register_00000009;
  bool bVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  size_t __n;
  byte bVar31;
  int iVar32;
  int iVar33;
  AV1_COMMON *cm;
  int iVar34;
  ulong uVar35;
  RD_STATS *pRVar36;
  bool bVar37;
  uint8_t uv_skip_txfm;
  int local_be0;
  int_mv local_bdc;
  ulong local_bd8;
  RD_STATS *local_bd0;
  int_mv best_mv;
  uint8_t y_skip_txfm;
  MB_MODE_INFO *local_bc0;
  MV dv;
  int_mv nearmv;
  long local_bb0;
  ulong local_ba8;
  MACROBLOCKD *local_ba0;
  AV1_COMMON *local_b98;
  ulong local_b90;
  ulong local_b88;
  int local_b7c;
  int local_b78;
  int local_b74;
  FULLPEL_MV local_b70;
  int local_b6c;
  int local_b68;
  int rate_uv_tokenonly;
  int rate_uv;
  int rate_y;
  int_mv best_hash_mv;
  int_mv nearestmv;
  uint8_t *local_b50;
  long local_b48;
  ulong local_b40;
  int64_t dist_uv;
  ulong local_b30;
  ulong local_b28;
  int **local_b20;
  PALETTE_MODE_INFO *local_b18;
  IntraBCMVCosts *local_b10;
  ulong local_b08;
  ulong local_b00;
  IntraBCHashInfo *local_af8;
  MB_MODE_INFO *local_af0;
  int64_t dist_y;
  int rate_y_tokenonly;
  RD_STATS best_rdstats;
  RD_STATS rd_stats_yuv;
  FULLPEL_MOTION_SEARCH_PARAMS local_a88;
  FULLPEL_MV_STATS best_mv_stats;
  buf_2d yv12_mb [3];
  RD_STATS local_938;
  RD_STATS rd_stats_y;
  MB_MODE_INFO best_mbmi;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  local_bd8 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  local_af0 = *(x->e_mbd).mi;
  uVar2 = ((cpi->common).seq_params)->monochrome;
  uVar19 = 0;
  rate_y = 0;
  rate_uv = 0;
  rate_y_tokenonly = 0;
  rate_uv_tokenonly = 0;
  y_skip_txfm = '\0';
  uv_skip_txfm = '\0';
  dist_y = 0;
  dist_uv = 0;
  (ctx->rd_stats).skip_txfm = '\0';
  local_af0->ref_frame[0] = '\0';
  local_af0->ref_frame[1] = -1;
  local_af0->mv[0].as_int = 0;
  local_af0->field_0xa7 = local_af0->field_0xa7 & 0x3f;
  local_bd0 = rd_cost;
  iVar21 = av1_rd_pick_intra_sby_mode
                     (cpi,x,&rate_y,&rate_y_tokenonly,&dist_y,&y_skip_txfm,(BLOCK_SIZE)local_bd8,
                      best_rd,ctx);
  pRVar36 = local_bd0;
  bVar37 = (cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;
  (x->txfm_search_params).use_qm_dist_metric = (uint)bVar37;
  (x->txfm_search_params).use_default_intra_tx_type = 0;
  (x->txfm_search_params).default_inter_tx_type_prob_thresh = 0x7fffffff;
  (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[0];
  (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[0];
  if (bVar37) {
    (x->txfm_search_params).use_transform_domain_distortion = 1;
  }
  else {
    (x->txfm_search_params).use_transform_domain_distortion =
         (cpi->winner_mode_params).use_transform_domain_distortion[0];
    uVar19 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
  }
  (x->txfm_search_params).tx_domain_dist_threshold = uVar19;
  (x->txfm_search_params).coeff_opt_thresholds[0] =
       (cpi->winner_mode_params).coeff_opt_thresholds[0][0];
  (x->txfm_search_params).coeff_opt_thresholds[1] =
       (cpi->winner_mode_params).coeff_opt_thresholds[0][1];
  TVar3 = (cpi->winner_mode_params).tx_size_search_methods[0];
  (x->txfm_search_params).tx_size_search_method = TVar3;
  TVar24 = '\0';
  if ((cpi->common).features.coded_lossless == false) {
    TVar24 = '\x02' - (TVar3 == '\x02');
  }
  (x->txfm_search_params).tx_mode_search_type = TVar24;
  (x->txfm_search_params).prune_2d_txfm_mode =
       (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
  if (((x->txfm_search_params).mode_eval_type != 0) &&
     (pMVar5 = (x->txfm_search_info).mb_rd_record, pMVar5 != (MB_RD_RECORD *)0x0)) {
    pMVar5->index_start = 0;
    pMVar5->num = 0;
  }
  cm = &cpi->common;
  (x->txfm_search_params).mode_eval_type = 0;
  if (best_rd <= iVar21) {
    local_bd0->rate = 0x7fffffff;
    goto LAB_002082c3;
  }
  iVar29 = 0;
  if (uVar2 == '\0') {
    if (((x->e_mbd).is_chroma_ref == true) && (((cpi->common).seq_params)->monochrome == '\0')) {
      pMVar6 = *(x->e_mbd).mi;
      uVar35 = (ulong)pMVar6->bsize;
      if ((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) {
        bVar37 = (0x2f0bffUL >> (uVar35 & 0x3f) & 1) != 0;
        if ((0x1f07ffUL >> (uVar35 & 0x3f) & 1) == 0) goto LAB_002081bf;
      }
      else {
        bVar37 = av1_ss_size_lookup[uVar35][(x->e_mbd).plane[1].subsampling_x]
                 [(x->e_mbd).plane[1].subsampling_y] == BLOCK_4X4;
      }
      if (bVar37) {
        memcpy((x->txfm_search_info).blk_skip,ctx->blk_skip,(long)ctx->num_4x4_blk);
        memcpy((x->e_mbd).tx_type_map,ctx->tx_type_map,(long)ctx->num_4x4_blk);
      }
    }
LAB_002081bf:
    pMVar6 = *(x->e_mbd).mi;
    if ((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) {
      bVar31 = ""[av1_ss_size_lookup[pMVar6->bsize][(x->e_mbd).plane[1].subsampling_x]
                  [(x->e_mbd).plane[1].subsampling_y]];
      if (bVar31 < 0x11) {
        bVar17 = 3;
        if ((1 < bVar31 - 0xb) && (bVar31 != 4)) {
LAB_00208631:
          bVar17 = bVar31;
        }
      }
      else if (bVar31 == 0x11) {
        bVar17 = 9;
      }
      else {
        if (bVar31 != 0x12) goto LAB_00208631;
        bVar17 = 10;
      }
    }
    else {
      bVar17 = 0;
    }
    local_b98 = cm;
    av1_rd_pick_intra_sbuv_mode
              (cpi,x,&rate_uv,&rate_uv_tokenonly,&dist_uv,&uv_skip_txfm,(BLOCK_SIZE)local_bd8,bVar17
              );
    cm = local_b98;
    iVar29 = rate_uv;
  }
  pMVar6 = (x->e_mbd).left_mbmi;
  pMVar7 = (x->e_mbd).above_mbmi;
  if (pMVar7 == (MB_MODE_INFO *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar19 = (uint)pMVar7->skip_txfm;
  }
  if (pMVar6 == (MB_MODE_INFO *)0x0) {
    uVar28 = 0;
  }
  else {
    uVar28 = (uint)pMVar6->skip_txfm;
  }
  lVar22 = (long)iVar29 + (long)rate_y + (long)(x->mode_costs).skip_txfm_cost[uVar28 + uVar19][0];
  iVar29 = (int)lVar22;
  pRVar36->rate = iVar29;
  pRVar36->dist = dist_uv + dist_y;
  lVar22 = (dist_uv + dist_y) * 0x80 + (x->rdmult * lVar22 + 0x100 >> 9);
  pRVar36->rdcost = lVar22;
  pRVar36->skip_txfm = '\0';
  if ((iVar29 != 0x7fffffff) && (lVar22 < best_rd)) {
    best_rd = lVar22;
  }
LAB_002082c3:
  if (((((((cm->current_frame).frame_type & 0xfd) == 0) &&
        ((cpi->common).features.allow_screen_content_tools == true)) &&
       ((cpi->common).features.allow_intrabc != false)) &&
      (((cpi->oxcf).kf_cfg.enable_intrabc == true && ((cpi->sf).mv_sf.use_intrabc != 0)))) &&
     ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) {
    pSVar8 = (cpi->common).seq_params;
    uVar2 = pSVar8->monochrome;
    local_ba0 = &x->e_mbd;
    local_bc0 = *(x->e_mbd).mi;
    local_be0 = (x->e_mbd).mi_row;
    local_b68 = (x->e_mbd).mi_col;
    local_ba8 = local_bd8 & 0xff;
    local_b88 = (ulong)block_size_wide[local_ba8];
    bVar31 = (byte)pSVar8->mib_size_log2;
    local_b40 = (ulong)(uint)(local_be0 >> (bVar31 & 0x1f));
    local_bd8 = CONCAT44(local_bd8._4_4_,local_b68);
    local_b68 = local_b68 >> (bVar31 & 0x1f);
    local_b90 = (ulong)block_size_high[local_ba8];
    local_b98 = cm;
    local_b48 = best_rd;
    av1_find_mv_refs(cm,local_ba0,local_bc0,'\0',(x->mbmi_ext).ref_mv_count,(x->e_mbd).ref_mv_stack,
                     (x->e_mbd).weight,(int_mv (*) [2])0x0,(x->mbmi_ext).global_mvs,
                     (x->mbmi_ext).mode_context);
    (x->mbmi_ext).weight[0] = *(uint16_t (*) [4])(x->e_mbd).weight[0];
    CVar9 = (x->e_mbd).ref_mv_stack[0][1];
    CVar10 = (x->e_mbd).ref_mv_stack[0][2];
    CVar11 = (x->e_mbd).ref_mv_stack[0][3];
    (x->mbmi_ext).ref_mv_stack[0][0] = (x->e_mbd).ref_mv_stack[0][0];
    (x->mbmi_ext).ref_mv_stack[0][1] = CVar9;
    (x->mbmi_ext).ref_mv_stack[0][2] = CVar10;
    (x->mbmi_ext).ref_mv_stack[0][3] = CVar11;
    av1_find_best_ref_mvs_from_stack(0,&x->mbmi_ext,'\0',&nearestmv,&nearmv,0);
    if (nearestmv.as_int == 0x80008000) {
      nearestmv.as_int = 0;
    }
    if (nearmv.as_int == 0x80008000) {
      nearmv.as_int = 0;
    }
    iVar29 = (uint)(uVar2 == '\0') * 2 + 1;
    local_bdc = nearmv;
    if (nearestmv.as_int != 0) {
      local_bdc = nearestmv;
    }
    if ((MV)local_bdc.as_int == (MV)0x0) {
      iVar30 = ((cpi->common).seq_params)->mib_size;
      local_bdc.as_int = iVar30 * 0xffe0 & 0xffff;
      if (local_be0 - iVar30 < (x->e_mbd).tile.mi_row_start) {
        local_bdc.as_int = iVar30 * -0x200000 + 0xf8000000;
      }
    }
    (x->mbmi_ext).ref_mv_stack[0][0].this_mv.as_mv = (MV)local_bdc;
    uVar35 = 0;
    av1_setup_pred_block
              (local_ba0,yv12_mb,(x->e_mbd).cur_buf,(scale_factors *)0x0,(scale_factors *)0x0,iVar29
              );
    pbVar23 = (x->e_mbd).plane[0].pre;
    do {
      puVar12 = *(uint8_t **)((long)&yv12_mb[0].buf + uVar35);
      puVar13 = *(uint8_t **)((long)&yv12_mb[0].buf0 + uVar35);
      uVar14 = *(undefined8 *)((long)&yv12_mb[0].width + uVar35);
      uVar15 = *(undefined8 *)((long)&yv12_mb[0].stride + uVar35);
      pbVar23->width = (int)uVar14;
      pbVar23->height = (int)((ulong)uVar14 >> 0x20);
      *(undefined8 *)&pbVar23->stride = uVar15;
      pbVar23->buf = puVar12;
      pbVar23->buf0 = puVar13;
      uVar35 = uVar35 + 0x20;
      pbVar23 = (buf_2d *)((long)(pbVar23 + 0x51) + 0x10);
    } while ((uint)(iVar29 * 0x20) != uVar35);
    memcpy(&best_mbmi,local_bc0,0xb0);
    pRVar36 = local_bd0;
    best_rdstats.skip_txfm = local_bd0->skip_txfm;
    best_rdstats._33_7_ = *(undefined7 *)&local_bd0->field_0x21;
    best_rdstats.rate = local_bd0->rate;
    best_rdstats.zero_rate = local_bd0->zero_rate;
    best_rdstats.dist = local_bd0->dist;
    best_rdstats.rdcost = local_bd0->rdcost;
    best_rdstats.sse = local_bd0->sse;
    memset(best_blk_skip,0,0x400);
    memcpy(best_tx_type_map,(x->e_mbd).tx_type_map,(long)ctx->num_4x4_blk);
    iVar30 = local_be0;
    bVar31 = (cpi->sf).mv_sf.search_method;
    iVar29 = (cpi->sf).mv_sf.use_bsize_dependent_search_method;
    bVar17 = (byte)local_b90;
    if ((byte)local_b88 < (byte)local_b90) {
      bVar17 = (byte)local_b88;
    }
    if ((0x1f < bVar17 && iVar29 == 1) ||
       (((0xf < bVar17 && 1 < iVar29 && ((x->content_state_sb).source_sad_nonrd < kHighSad)) &&
        (x->qindex < 0xc0)))) {
      if (bVar31 < 0xb) {
        bVar31 = (&DAT_005001f8)[bVar31];
      }
      else {
        bVar31 = 0;
      }
    }
    local_b70 = (FULLPEL_MV)
                (((int)local_bdc.as_mv.row - (~(int)local_bdc.as_mv.row >> 0x1f)) + 3U >> 3 & 0xffff
                | ((int)local_bdc.as_mv.col - (~(int)local_bdc.as_mv.col >> 0x1f)) * 0x2000 +
                  0x6000U & 0xffff0000);
    av1_make_default_fullpel_ms_params
              (&local_a88,cpi,x,(BLOCK_SIZE)local_ba8,&local_bdc.as_mv,local_b70,
               (cpi->mv_search_params).search_site_cfg[1],bVar31,0);
    dv_costs = x->dv_costs;
    av1_set_ms_to_intra_mode(&local_a88,dv_costs);
    local_b6c = (int)local_b40 + 1;
    local_af8 = &x->intrabc_hash_info;
    local_b74 = iVar30 << 5;
    local_b78 = (int)local_bd8 << 5;
    local_b28 = 0x10003L >> ((byte)local_ba8 & 0x3f);
    local_b30 = 0x20005L >> ((byte)local_ba8 & 0x3f);
    local_b00 = (ulong)(uint)((int)local_b90 * 8);
    local_b08 = (ulong)(uint)((int)local_b88 * 8);
    local_b7c = ((int)local_bd8 >> 4) + -4;
    local_b18 = &local_bc0->palette_mode_info;
    local_b20 = dv_costs->dv_costs;
    local_b50 = (x->txfm_search_info).blk_skip;
    local_bb0 = local_b48;
    bVar18 = false;
    local_b10 = dv_costs;
    bVar37 = true;
    do {
      bVar27 = bVar37;
      local_a88.mv_limits.col_min = ((x->e_mbd).tile.mi_col_start - (int)local_bd8) * 4;
      if (bVar18) {
        iVar29 = ((cpi->common).seq_params)->mib_size;
        iVar25 = iVar29 * local_b68;
        iVar29 = iVar29 * local_b6c;
        iVar33 = (x->e_mbd).tile.mi_row_end;
        if (iVar33 <= iVar29) {
          iVar29 = iVar33;
        }
      }
      else {
        iVar25 = (x->e_mbd).tile.mi_col_end;
        iVar29 = ((cpi->common).seq_params)->mib_size * (int)local_b40;
      }
      local_a88.mv_limits.row_min = ((x->e_mbd).tile.mi_row_start - iVar30) * 4;
      local_a88.mv_limits.col_max = (iVar25 - (int)local_bd8) * 4 - (int)local_b88;
      local_a88.mv_limits.row_max = (iVar29 - iVar30) * 4 - (int)local_b90;
      av1_set_mv_search_range(&local_a88.mv_limits,&local_bdc.as_mv);
      if ((local_a88.mv_limits.col_min <= local_a88.mv_limits.col_max) &&
         (local_a88.mv_limits.row_min <= local_a88.mv_limits.row_max)) {
        iVar29 = av1_full_pixel_search
                           (local_b70,&local_a88,(cpi->mv_search_params).mv_step_param,(int *)0x0,
                            &best_mv.as_fullmv,&best_mv_stats,(FULLPEL_MV *)0x0);
        iVar25 = av1_intrabc_hash_search(cpi,local_ba0,&local_a88,local_af8,&best_hash_mv.as_fullmv)
        ;
        iVar30 = local_be0;
        if (iVar25 < iVar29) {
          best_mv = best_hash_mv;
          uVar19 = best_hash_mv.as_int >> 0x10;
          iVar26 = best_hash_mv;
        }
        else {
          if (iVar29 == 0x7fffffff) goto LAB_0020888d;
          iVar26.as_int = best_mv.as_int & 0xffff;
          uVar19 = best_mv.as_int >> 0x10;
        }
        dv = (MV)(iVar26.as_int << 3 & 0xffff | uVar19 << 0x13);
        iVar29 = (int)(uVar19 << 0x13) >> 0x13;
        if ((local_a88.mv_limits.col_min <= iVar29) && (iVar29 <= local_a88.mv_limits.col_max)) {
          iVar25 = (int)(short)(iVar26.as_int << 3);
          iVar29 = iVar25 >> 3;
          if ((local_a88.mv_limits.row_min <= iVar29) && (iVar29 <= local_a88.mv_limits.row_max)) {
            iVar25 = iVar25 + local_b74;
            iVar29 = (x->e_mbd).tile.mi_row_start * 0x20;
            if (iVar29 <= iVar25) {
              iVar33 = (short)(uVar19 << 3) + local_b78;
              uVar19 = (x->e_mbd).tile.mi_col_start;
              iVar34 = uVar19 * 0x20;
              if ((iVar34 <= iVar33) &&
                 (iVar20 = (int)local_b00 + iVar25, iVar20 <= (x->e_mbd).tile.mi_row_end * 0x20)) {
                iVar32 = iVar33 + (int)local_b08;
                iVar4 = (x->e_mbd).tile.mi_col_end;
                if (iVar32 <= iVar4 * 0x20) {
                  pSVar8 = (cpi->common).seq_params;
                  pRVar36 = local_bd0;
                  if ((((x->e_mbd).is_chroma_ref != true) || (pSVar8->monochrome != '\0')) ||
                     ((((local_b28 & 1) == 0 ||
                       (((x->e_mbd).plane[1].subsampling_x == 0 || (iVar34 + 0x20 <= iVar33)))) &&
                      (((local_b30 & 1) == 0 ||
                       (((x->e_mbd).plane[1].subsampling_y == 0 || (iVar29 + 0x20 <= iVar25))))))))
                  {
                    bVar31 = (byte)pSVar8->mib_size_log2;
                    iVar25 = local_be0 >> (bVar31 & 0x1f);
                    iVar33 = 4 << (bVar31 & 0x1f);
                    iVar29 = ((iVar20 >> 3) + -1) / iVar33;
                    if ((iVar29 <= iVar25) &&
                       ((iVar34 = (iVar32 >> 3) + -1 >> 6,
                        iVar20 = ((int)(iVar4 + ~uVar19) >> 4) + 1,
                        iVar29 * iVar20 + iVar34 < iVar25 * iVar20 + local_b7c &&
                        (iVar34 < (int)((iVar25 - iVar29) * ((0x40 < iVar33) + 5) + local_b7c))))) {
                      local_b18->palette_colors[0x10] = 0;
                      local_b18->palette_colors[0x11] = 0;
                      local_b18->palette_colors[0x12] = 0;
                      local_b18->palette_colors[0x13] = 0;
                      local_b18->palette_colors[0x14] = 0;
                      local_b18->palette_colors[0x15] = 0;
                      local_b18->palette_colors[0x16] = 0;
                      local_b18->palette_colors[0x17] = 0;
                      local_b18->palette_colors[8] = 0;
                      local_b18->palette_colors[9] = 0;
                      local_b18->palette_colors[10] = 0;
                      local_b18->palette_colors[0xb] = 0;
                      local_b18->palette_colors[0xc] = 0;
                      local_b18->palette_colors[0xd] = 0;
                      local_b18->palette_colors[0xe] = 0;
                      local_b18->palette_colors[0xf] = 0;
                      local_b18->palette_colors[0] = 0;
                      local_b18->palette_colors[1] = 0;
                      local_b18->palette_colors[2] = 0;
                      local_b18->palette_colors[3] = 0;
                      local_b18->palette_colors[4] = 0;
                      local_b18->palette_colors[5] = 0;
                      local_b18->palette_colors[6] = 0;
                      local_b18->palette_colors[7] = 0;
                      local_b18->palette_size[0] = '\0';
                      local_b18->palette_size[1] = '\0';
                      (local_bc0->filter_intra_mode_info).use_filter_intra = '\0';
                      local_bc0->field_0xa7 = local_bc0->field_0xa7 | 0x80;
                      local_bc0->mode = '\0';
                      local_bc0->uv_mode = '\0';
                      local_bc0->motion_mode = '\0';
                      local_bc0->mv[0].as_mv = dv;
                      (local_bc0->interp_filters).as_int = 0x30003;
                      local_bc0->skip_txfm = '\0';
                      bsize_00 = (BLOCK_SIZE)local_ba8;
                      av1_enc_build_inter_predictor
                                (local_b98,local_ba0,local_be0,(int)local_bd8,(BUFFER_SET *)0x0,
                                 bsize_00,0,
                                 (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2);
                      iVar29 = av1_mv_bit_cost(&dv,&local_bdc.as_mv,local_b10->joint_mv,local_b20,
                                               0x78);
                      iVar29 = av1_txfm_search(cpi,x,bsize_00,&rd_stats_yuv,&rd_stats_y,&local_938,
                                               iVar29 + (x->mode_costs).intrabc_cost[1],
                                               0x7fffffffffffffff);
                      pRVar36 = local_bd0;
                      if ((iVar29 != 0) &&
                         (lVar22 = rd_stats_yuv.dist * 0x80 +
                                   ((long)x->rdmult * (long)rd_stats_yuv.rate + 0x100 >> 9),
                         rd_stats_yuv.rdcost = lVar22, lVar22 < local_bb0)) {
                        memcpy(&best_mbmi,local_bc0,0xb0);
                        best_rdstats.zero_rate = rd_stats_yuv.zero_rate;
                        best_rdstats.rate = rd_stats_yuv.rate;
                        best_rdstats.dist = rd_stats_yuv.dist;
                        best_rdstats.rdcost = rd_stats_yuv.rdcost;
                        best_rdstats.sse = rd_stats_yuv.sse;
                        best_rdstats.skip_txfm = rd_stats_yuv.skip_txfm;
                        best_rdstats._33_7_ = rd_stats_yuv._33_7_;
                        __n = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
                        memcpy(best_blk_skip,local_b50,__n);
                        iVar30 = local_be0;
                        memcpy(best_tx_type_map,(x->e_mbd).tx_type_map,__n);
                        pRVar36 = local_bd0;
                        local_bb0 = lVar22;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0020888d:
      bVar18 = true;
      bVar37 = false;
    } while (bVar27);
    memcpy(local_bc0,&best_mbmi,0xb0);
    puVar12 = local_b50;
    pRVar36->rate = best_rdstats.rate;
    pRVar36->zero_rate = best_rdstats.zero_rate;
    pRVar36->dist = best_rdstats.dist;
    pRVar36->rdcost = best_rdstats.rdcost;
    pRVar36->sse = best_rdstats.sse;
    pRVar36->skip_txfm = best_rdstats.skip_txfm;
    *(undefined7 *)&pRVar36->field_0x21 = best_rdstats._33_7_;
    memcpy(local_b50,best_blk_skip,(ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height);
    memcpy((x->e_mbd).tx_type_map,best_tx_type_map,(long)ctx->num_4x4_blk);
    if (local_bb0 < local_b48) {
      (ctx->rd_stats).skip_txfm = local_af0->skip_txfm;
      memcpy(ctx->blk_skip,puVar12,(long)ctx->num_4x4_blk);
    }
  }
  if (pRVar36->rate != 0x7fffffff) {
    memcpy(ctx,*(x->e_mbd).mi,0xb0);
    pMVar6 = *(x->e_mbd).mi;
    bVar31 = pMVar6->ref_frame[0];
    bVar17 = pMVar6->ref_frame[1];
    if ('\0' < (char)bVar17) {
      if (bVar17 < 5 || '\x04' < (char)bVar31) {
        lVar22 = 0;
        do {
          if ((bVar31 == (&comp_ref0_lut)[lVar22]) && (bVar17 == (&comp_ref1_lut)[lVar22])) {
            bVar31 = (char)lVar22 + 0x14;
            goto LAB_00208dfb;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 9);
      }
      bVar31 = (bVar17 * '\x04' + bVar31) - 0xd;
    }
LAB_00208dfb:
    pCVar1 = (x->mbmi_ext).ref_mv_stack[bVar31];
    CVar9 = *pCVar1;
    CVar10 = pCVar1[1];
    pCVar1 = (x->mbmi_ext).ref_mv_stack[bVar31] + 2;
    CVar11 = pCVar1[1];
    (ctx->mbmi_ext_best).ref_mv_stack[2] = *pCVar1;
    (ctx->mbmi_ext_best).ref_mv_stack[3] = CVar11;
    (ctx->mbmi_ext_best).ref_mv_stack[0] = CVar9;
    (ctx->mbmi_ext_best).ref_mv_stack[1] = CVar10;
    *&(ctx->mbmi_ext_best).weight = (x->mbmi_ext).weight[bVar31];
    (ctx->mbmi_ext_best).mode_context = (x->mbmi_ext).mode_context[bVar31];
    (ctx->mbmi_ext_best).ref_mv_count = (x->mbmi_ext).ref_mv_count[bVar31];
    uVar14 = *(undefined8 *)((x->mbmi_ext).global_mvs + 2);
    uVar15 = *(undefined8 *)((x->mbmi_ext).global_mvs + 4);
    uVar16 = *(undefined8 *)((x->mbmi_ext).global_mvs + 6);
    *(undefined8 *)(ctx->mbmi_ext_best).global_mvs = *(undefined8 *)(x->mbmi_ext).global_mvs;
    *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 2) = uVar14;
    *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 4) = uVar15;
    *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 6) = uVar16;
    memcpy(ctx->tx_type_map,(x->e_mbd).tx_type_map,(long)ctx->num_4x4_blk);
  }
  return;
}

Assistant:

void av1_rd_pick_intra_mode_sb(const struct AV1_COMP *cpi, struct macroblock *x,
                               struct RD_STATS *rd_cost, BLOCK_SIZE bsize,
                               PICK_MODE_CONTEXT *ctx, int64_t best_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int num_planes = av1_num_planes(cm);
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int rate_y = 0, rate_uv = 0, rate_y_tokenonly = 0, rate_uv_tokenonly = 0;
  uint8_t y_skip_txfm = 0, uv_skip_txfm = 0;
  int64_t dist_y = 0, dist_uv = 0;

  ctx->rd_stats.skip_txfm = 0;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->use_intrabc = 0;
  mbmi->mv[0].as_int = 0;
  mbmi->skip_mode = 0;

  const int64_t intra_yrd =
      av1_rd_pick_intra_sby_mode(cpi, x, &rate_y, &rate_y_tokenonly, &dist_y,
                                 &y_skip_txfm, bsize, best_rd, ctx);

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  if (intra_yrd < best_rd) {
    // Search intra modes for uv planes if needed
    if (num_planes > 1) {
      // Set up the tx variables for reproducing the y predictions in case we
      // need it for chroma-from-luma.
      if (xd->is_chroma_ref && store_cfl_required_rdo(cm, x)) {
        memcpy(txfm_info->blk_skip, ctx->blk_skip,
               sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
        av1_copy_array(xd->tx_type_map, ctx->tx_type_map, ctx->num_4x4_blk);
      }
      const TX_SIZE max_uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
      av1_rd_pick_intra_sbuv_mode(cpi, x, &rate_uv, &rate_uv_tokenonly,
                                  &dist_uv, &uv_skip_txfm, bsize,
                                  max_uv_tx_size);
    }

    // Intra block is always coded as non-skip
    rd_cost->rate =
        rate_y + rate_uv +
        x->mode_costs.skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
    rd_cost->dist = dist_y + dist_uv;
    rd_cost->rdcost = RDCOST(x->rdmult, rd_cost->rate, rd_cost->dist);
    rd_cost->skip_txfm = 0;
  } else {
    rd_cost->rate = INT_MAX;
  }

  if (rd_cost->rate != INT_MAX && rd_cost->rdcost < best_rd)
    best_rd = rd_cost->rdcost;
  if (rd_pick_intrabc_mode_sb(cpi, x, ctx, rd_cost, bsize, best_rd) < best_rd) {
    ctx->rd_stats.skip_txfm = mbmi->skip_txfm;
    memcpy(ctx->blk_skip, txfm_info->blk_skip,
           sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
    assert(rd_cost->rate != INT_MAX);
  }
  if (rd_cost->rate == INT_MAX) return;

  ctx->mic = *xd->mi[0];
  av1_copy_mbmi_ext_to_mbmi_ext_frame(&ctx->mbmi_ext_best, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
}